

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O0

char * tcg_get_arg_str(TCGContext_conflict9 *s,char *buf,int buf_size,TCGArg arg)

{
  TCGTemp *ts;
  char *pcVar1;
  TCGArg arg_local;
  int buf_size_local;
  char *buf_local;
  TCGContext_conflict9 *s_local;
  
  ts = arg_temp(arg);
  pcVar1 = tcg_get_arg_str_ptr(s,buf,buf_size,ts);
  return pcVar1;
}

Assistant:

static char *tcg_get_arg_str(TCGContext *s, char *buf,
                             int buf_size, TCGArg arg)
{
    return tcg_get_arg_str_ptr(s, buf, buf_size, arg_temp(arg));
}